

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O3

string * __thiscall
cmQtAutoGenerator::MessagePath_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGenerator *this,string_view path)

{
  size_type __n1;
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  char *__n1_00;
  ulong uVar4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view text;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  string res;
  undefined1 *local_98;
  cmQtAutoGen *local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  string local_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_58;
  long local_40;
  char *local_38;
  undefined8 local_30;
  
  pcVar3 = path._M_str;
  uVar4 = path._M_len;
  local_90 = (cmQtAutoGen *)0x0;
  local_88 = 0;
  __n1 = (this->ProjectDirs_).Source._M_string_length;
  __str._M_str = (this->ProjectDirs_).Source._M_dataplus._M_p;
  __str._M_len = __n1;
  local_98 = &local_88;
  local_58.first._M_len = uVar4;
  local_58.first._M_str = pcVar3;
  iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    (&local_58.first,0,__n1,__str);
  if (iVar2 == 0) {
    uVar1 = (this->ProjectDirs_).Source._M_string_length;
    local_40 = uVar4 - uVar1;
    if (uVar4 < uVar1) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar1,uVar4);
    }
    local_38 = pcVar3 + uVar1;
    local_58.first._M_len = 4;
    local_58.first._M_str = "SRC:";
    __n1_00 = (char *)0x0;
    local_58.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_30 = 0;
    views._M_len = 2;
    views._M_array = &local_58;
    cmCatViews(&local_78,views);
LAB_00551ce0:
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_00551d0a;
  }
  else {
    __n1_00 = (char *)(this->ProjectDirs_).Binary._M_string_length;
    __str_00._M_str = (this->ProjectDirs_).Binary._M_dataplus._M_p;
    __str_00._M_len = (size_t)__n1_00;
    local_58.first._M_len = uVar4;
    local_58.first._M_str = pcVar3;
    iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (&local_58.first,0,(size_type)__n1_00,__str_00);
    if (iVar2 == 0) {
      uVar1 = (this->ProjectDirs_).Binary._M_string_length;
      local_40 = uVar4 - uVar1;
      if (uVar4 < uVar1) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar1,uVar4);
      }
      local_38 = pcVar3 + uVar1;
      local_58.first._M_len = 4;
      local_58.first._M_str = "BIN:";
      __n1_00 = (char *)0x0;
      local_58.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_30 = 0;
      views_00._M_len = 2;
      views_00._M_array = &local_58;
      cmCatViews(&local_78,views_00);
      goto LAB_00551ce0;
    }
    local_58.first._M_len = (size_t)&local_58.second;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar3,pcVar3 + uVar4);
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_58);
    local_78.field_2._M_allocated_capacity = (size_type)local_58.second;
    local_78._M_dataplus._M_p = (pointer)local_58.first._M_len;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_58.first._M_len
        == &local_58.second) goto LAB_00551d0a;
  }
  operator_delete(local_78._M_dataplus._M_p,
                  (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_78.field_2._M_allocated_capacity)->_M_dataplus)._M_p + 1
                         ));
LAB_00551d0a:
  text._M_str = __n1_00;
  text._M_len = (size_t)local_98;
  cmQtAutoGen::Quoted_abi_cxx11_(__return_storage_ptr__,local_90,text);
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerator::MessagePath(cm::string_view path) const
{
  std::string res;
  if (cmHasPrefix(path, this->ProjectDirs().Source)) {
    res = cmStrCat("SRC:", path.substr(this->ProjectDirs().Source.size()));
  } else if (cmHasPrefix(path, this->ProjectDirs().Binary)) {
    res = cmStrCat("BIN:", path.substr(this->ProjectDirs().Binary.size()));
  } else {
    res = std::string(path);
  }
  return cmQtAutoGen::Quoted(res);
}